

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O1

bool __thiscall
BlockFilterIndex::CustomRewind(BlockFilterIndex *this,BlockRef *current_tip,BlockRef *new_tip)

{
  string *args_1;
  DataStream *s;
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  __uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true> this_00;
  optional<uint256> *poVar9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  Span<const_std::byte> key_00;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> db_it;
  CDBBatch batch;
  int local_d0;
  DBHeightKey key;
  DBHashKey local_c8;
  pair<uint256,_(anonymous_namespace)::DBVal> value;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  CDBBatch::CDBBatch(&batch,&((this->m_db)._M_t.
                              super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                              .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                             super_CDBWrapper);
  this_00.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>)
       CDBWrapper::NewIterator
                 (&((this->m_db)._M_t.
                    super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
                    super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                    super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper);
  iVar1 = new_tip->height;
  iVar2 = current_tip->height;
  db_it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       this_00.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl;
  key.height = iVar1;
  CDBIterator::Seek<(anonymous_namespace)::DBHeightKey>
            ((CDBIterator *)
             this_00.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
             super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
             super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&key);
  bVar8 = iVar2 < iVar1;
  local_d0 = iVar1;
  if (iVar1 <= iVar2) {
    args_1 = &(this->super_BaseIndex).m_name;
    s = &batch.ssValue;
    bVar8 = false;
    do {
      bVar7 = CDBIterator::GetKey<(anonymous_namespace)::DBHeightKey>
                        ((CDBIterator *)
                         this_00.
                         super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                         super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                         super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&key);
      if ((!bVar7) || (key.height != local_d0)) {
        logging_function_00._M_str = "CopyHeightIndexToHashIndex";
        logging_function_00._M_len = 0x1a;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
        ;
        source_file_00._M_len = 0x6a;
        LogPrintFormatInternal<char[27],std::__cxx11::string,unsigned_char,int>
                  (logging_function_00,source_file_00,0x12d,ALL,Error,
                   (ConstevalFormatString<4U>)0x82cd71,(char (*) [27])"CopyHeightIndexToHashIndex",
                   args_1,"tscoinstats",&local_d0);
        break;
      }
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      value.second.header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      value.second.hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      value.first.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      value.second.pos.nFile = -1;
      value.second.pos.nPos = 0;
      bVar7 = CDBIterator::GetValue<std::pair<uint256,(anonymous_namespace)::DBVal>>
                        ((CDBIterator *)
                         this_00.
                         super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                         super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                         super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&value);
      if (bVar7) {
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x10];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x11];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x12];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x13];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x14];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x15];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x16];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x17];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x18] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x18];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x19] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x19];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x1a];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x1b];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x1c];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x1d];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x1e];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
             value.first.super_base_blob<256U>.m_data._M_elems[0x1f];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0] =
             value.first.super_base_blob<256U>.m_data._M_elems[0];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[1] =
             value.first.super_base_blob<256U>.m_data._M_elems[1];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[2] =
             value.first.super_base_blob<256U>.m_data._M_elems[2];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[3] =
             value.first.super_base_blob<256U>.m_data._M_elems[3];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[4] =
             value.first.super_base_blob<256U>.m_data._M_elems[4];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[5] =
             value.first.super_base_blob<256U>.m_data._M_elems[5];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[6] =
             value.first.super_base_blob<256U>.m_data._M_elems[6];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[7] =
             value.first.super_base_blob<256U>.m_data._M_elems[7];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[8] =
             value.first.super_base_blob<256U>.m_data._M_elems[8];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[9] =
             value.first.super_base_blob<256U>.m_data._M_elems[9];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[10] =
             value.first.super_base_blob<256U>.m_data._M_elems[10];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             value.first.super_base_blob<256U>.m_data._M_elems[0xb];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             value.first.super_base_blob<256U>.m_data._M_elems[0xc];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             value.first.super_base_blob<256U>.m_data._M_elems[0xd];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             value.first.super_base_blob<256U>.m_data._M_elems[0xe];
        local_c8.hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             value.first.super_base_blob<256U>.m_data._M_elems[0xf];
        std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
                  (&batch.ssKey.vch,batch.ssKey.m_read_pos + 0x40);
        std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
                  (&s->vch,batch.ssValue.m_read_pos + 0x400);
        DataStream::operator<<(&batch.ssKey,&local_c8);
        SerializeMany<DataStream,uint256,uint256,FlatFilePos>
                  (s,&value.second.hash,&value.second.header,&value.second.pos);
        key_00.m_data =
             batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + batch.ssKey.m_read_pos;
        key_00.m_size =
             (long)batch.ssKey.vch.
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)key_00.m_data;
        CDBBatch::WriteImpl(&batch,key_00,s);
        if (batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        batch.ssKey.m_read_pos = 0;
        if (batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               batch.ssValue.vch.
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        batch.ssValue.m_read_pos = 0;
        CDBIterator::Next((CDBIterator *)
                          this_00.
                          super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t
                          .super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                          super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      }
      else {
        logging_function._M_str = "CopyHeightIndexToHashIndex";
        logging_function._M_len = 0x1a;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
        ;
        source_file._M_len = 0x6a;
        LogPrintFormatInternal<char[27],std::__cxx11::string,unsigned_char,int>
                  (logging_function,source_file,0x134,ALL,Error,(ConstevalFormatString<4U>)0x82cd9e,
                   (char (*) [27])"CopyHeightIndexToHashIndex",args_1,"tscoinstats",&local_d0);
      }
      if (!bVar7) break;
      iVar1 = local_d0 + 1;
      bVar8 = iVar2 <= local_d0;
      bVar7 = local_d0 < iVar2;
      local_d0 = iVar1;
    } while (bVar7);
  }
  if (bVar8) {
    CDBBatch::Write<unsigned_char,FlatFilePos>
              (&batch,"P16BlockFilterIndex",&this->m_next_filter_pos);
    bVar8 = CDBWrapper::WriteBatch
                      (&((this->m_db)._M_t.
                         super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                         .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                        super_CDBWrapper,&batch,false);
    if (bVar8) {
      ReadFilterHeader((optional<uint256> *)&value,this,new_tip->height,&new_tip->hash);
      poVar9 = inline_assertion_check<true,std::optional<uint256>>
                         ((optional<uint256> *)&value,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
                          ,0x152,"CustomRewind","ReadFilterHeader(new_tip.height, new_tip.hash)");
      uVar4 = *(undefined8 *)
               &(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                super__Optional_payload_base<uint256>._M_payload;
      uVar5 = *(undefined8 *)
               ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                       super__Optional_payload_base<uint256>._M_payload + 8);
      uVar6 = *(undefined8 *)
               ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                       super__Optional_payload_base<uint256>._M_payload + 0x18);
      *(undefined8 *)((this->m_last_header).super_base_blob<256U>.m_data._M_elems + 0x10) =
           *(undefined8 *)
            ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                    super__Optional_payload_base<uint256>._M_payload + 0x10);
      *(undefined8 *)((this->m_last_header).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar6;
      *(undefined8 *)(this->m_last_header).super_base_blob<256U>.m_data._M_elems = uVar4;
      *(undefined8 *)((this->m_last_header).super_base_blob<256U>.m_data._M_elems + 8) = uVar5;
      bVar8 = true;
      goto LAB_0047ca77;
    }
  }
  bVar8 = false;
LAB_0047ca77:
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&db_it);
  CDBBatch::~CDBBatch(&batch);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool BlockFilterIndex::CustomRewind(const interfaces::BlockRef& current_tip, const interfaces::BlockRef& new_tip)
{
    CDBBatch batch(*m_db);
    std::unique_ptr<CDBIterator> db_it(m_db->NewIterator());

    // During a reorg, we need to copy all filters for blocks that are getting disconnected from the
    // height index to the hash index so we can still find them when the height index entries are
    // overwritten.
    if (!CopyHeightIndexToHashIndex(*db_it, batch, m_name, new_tip.height, current_tip.height)) {
        return false;
    }

    // The latest filter position gets written in Commit by the call to the BaseIndex::Rewind.
    // But since this creates new references to the filter, the position should get updated here
    // atomically as well in case Commit fails.
    batch.Write(DB_FILTER_POS, m_next_filter_pos);
    if (!m_db->WriteBatch(batch)) return false;

    // Update cached header
    m_last_header = *Assert(ReadFilterHeader(new_tip.height, new_tip.hash));
    return true;
}